

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeGetNumStepStgrSensSolveFails(void *cvode_mem,long *nSTGR1ncfails)

{
  int iVar1;
  long in_RSI;
  CVodeMem in_RDI;
  int Ns;
  int is;
  CVodeMem cv_mem;
  int local_24;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x9bb,"CVodeGetNumStepStgrSensSolveFails",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    iVar1 = in_RDI->cv_Ns;
    if (in_RDI->cv_sensi == 0) {
      cvProcessError(in_RDI,-0x28,0x9c5,"CVodeGetNumStepStgrSensSolveFails",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                     ,"Forward sensitivity analysis not activated.");
      local_4 = -0x28;
    }
    else {
      if (in_RDI->cv_ism == 3) {
        for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
          *(long *)(in_RSI + (long)local_24 * 8) = in_RDI->cv_ncfnS1[local_24];
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CVodeGetNumStepStgrSensSolveFails(void* cvode_mem, long int* nSTGR1ncfails)
{
  CVodeMem cv_mem;
  int is, Ns;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  Ns = cv_mem->cv_Ns;

  if (cv_mem->cv_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  if (cv_mem->cv_ism == CV_STAGGERED1)
  {
    for (is = 0; is < Ns; is++) { nSTGR1ncfails[is] = cv_mem->cv_ncfnS1[is]; }
  }

  return (CV_SUCCESS);
}